

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void __thiscall PEnum::PEnum(PEnum *this,FName *name,DObject *outer)

{
  FName local_24;
  DObject *local_20;
  DObject *outer_local;
  FName *name_local;
  PEnum *this_local;
  
  local_20 = outer;
  outer_local = (DObject *)name;
  name_local = (FName *)this;
  FName::FName(&local_24,name);
  PNamedType::PNamedType(&this->super_PNamedType,&local_24,local_20);
  (this->super_PNamedType).super_PCompoundType.super_PType.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_00b6aa80;
  this->ValueType = (PType *)0x0;
  TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::TMap(&this->Values);
  return;
}

Assistant:

PEnum::PEnum(FName name, DObject *outer)
: PNamedType(name, outer), ValueType(NULL)
{
}